

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  size_type *psVar1;
  archive *paVar2;
  Compress CVar3;
  pointer pcVar4;
  cmCPackLog *pcVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  undefined8 uVar8;
  int iVar9;
  string *psVar10;
  long *plVar11;
  ostream *poVar12;
  size_t sVar13;
  _Base_ptr p_Var14;
  undefined8 *puVar15;
  _Rb_tree_node_base *p_Var16;
  ulong *puVar17;
  ulong *puVar18;
  undefined7 in_register_00000031;
  archive *paVar19;
  bool bVar20;
  string packageFileName;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  long *local_5f8;
  long local_5f0;
  long local_5e8 [2];
  string local_5d8;
  _Rb_tree_node_base *local_5b8;
  string *local_5b0;
  _Rb_tree_node_base *local_5a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_5a0;
  Deduplicator local_598;
  undefined1 local_4f0 [112];
  ios_base local_480 [264];
  undefined1 local_378 [64];
  _Alloc_hider local_338;
  size_type local_330;
  undefined1 local_298 [112];
  ios_base local_228 [504];
  
  local_5a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5a0,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    p_Var16 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left;
    local_5b8 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    bVar20 = p_Var16 == local_5b8;
    if (!bVar20) {
      local_5b0 = &this->ArchiveFormat;
      do {
        local_5a8 = (_Rb_tree_node_base *)CONCAT71(local_5a8._1_7_,bVar20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Packaging component group: ",0x1b);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent
                            );
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar5 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        uVar8 = local_4f0._0_8_;
        sVar13 = strlen((char *)local_4f0._0_8_);
        cmCPackLog::Log(pcVar5,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x14a,(char *)uVar8,sVar13);
        puVar18 = (ulong *)(local_298 + 0x10);
        if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
        local_4f0._0_8_ = local_4f0 + 0x10;
        pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f0,pcVar4,
                   pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        plVar11 = (long *)std::__cxx11::string::append((char *)local_4f0);
        puVar17 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar17) {
          local_298._16_8_ = *puVar17;
          local_298._24_8_ = plVar11[3];
          local_298._0_8_ = puVar18;
        }
        else {
          local_298._16_8_ = *puVar17;
          local_298._0_8_ = (ulong *)*plVar11;
        }
        local_298._8_8_ = plVar11[1];
        *plVar11 = (long)puVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        GetArchiveComponentFileName((string *)local_378,this,(string *)(p_Var16 + 1),true);
        paVar19 = (archive *)0xf;
        if ((ulong *)local_298._0_8_ != puVar18) {
          paVar19 = (archive *)local_298._16_8_;
        }
        paVar2 = (archive *)((long)(uint *)local_378._8_8_ + local_298._8_8_);
        if (paVar19 < paVar2) {
          paVar19 = (archive *)0xf;
          if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
            paVar19 = (archive *)local_378._16_8_;
          }
          if (paVar19 < paVar2) goto LAB_001e19f5;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_378,0,(char *)0x0,local_298._0_8_);
        }
        else {
LAB_001e19f5:
          puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_298,local_378._0_8_)
          ;
        }
        psVar1 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_5d8.field_2._M_allocated_capacity = *psVar1;
          local_5d8.field_2._8_8_ = puVar15[3];
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
        }
        else {
          local_5d8.field_2._M_allocated_capacity = *psVar1;
          local_5d8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_5d8._M_string_length = puVar15[1];
        *puVar15 = psVar1;
        puVar15[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
          operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
        }
        if ((ulong *)local_298._0_8_ != puVar18) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
          operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
        }
        local_598.Symlink._M_h._M_buckets = &local_598.Symlink._M_h._M_single_bucket;
        local_598.Symlink._M_h._M_bucket_count = 1;
        local_598.Symlink._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_598.Symlink._M_h._M_element_count = 0;
        local_598.Symlink._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_598.Symlink._M_h._M_rehash_policy._M_next_resize = 0;
        local_598.Symlink._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_598.Folders._M_h._M_buckets = &local_598.Folders._M_h._M_single_bucket;
        local_598.Folders._M_h._M_bucket_count = 1;
        local_598.Folders._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_598.Folders._M_h._M_element_count = 0;
        local_598.Folders._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_598.Folders._M_h._M_rehash_policy._M_next_resize = 0;
        local_598.Folders._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_598.Files._M_h._M_buckets = &local_598.Files._M_h._M_single_bucket;
        local_598.Files._M_h._M_bucket_count = 1;
        local_598.Files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_598.Files._M_h._M_element_count = 0;
        local_598.Files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_598.Files._M_h._M_rehash_policy._M_next_resize = 0;
        local_598.Files._M_h._M_single_bucket = (__node_base_ptr)0x0;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d8,false,true);
        iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                          (this,(ostringstream *)local_298);
        if (iVar9 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f0,"Problem to generate Header for archive <",0x28);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                               local_5d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,">.",2);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar5 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar8 = local_378._0_8_;
          sVar13 = strlen((char *)local_378._0_8_);
          cmCPackLog::Log(pcVar5,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x154,(char *)uVar8,sVar13);
          if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
          std::ios_base::~ios_base(local_480);
          bVar20 = false;
        }
        else {
          CVar3 = this->Compress;
          iVar9 = GetThreadCount(this);
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,local_5b0,0,iVar9);
          bVar20 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
          if (bVar20) {
            if (local_330 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,"Problem to create archive <",0x1b);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                   local_5d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
              local_5f8 = local_5e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_5f8,local_5f0);
              std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              if (local_5f8 != local_5e8) {
                operator_delete(local_5f8,local_5e8[0] + 1);
              }
              pcVar5 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              plVar11 = local_5f8;
              sVar13 = strlen((char *)local_5f8);
              cmCPackLog::Log(pcVar5,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0x154,(char *)plVar11,sVar13);
              goto LAB_001e1ed6;
            }
            p_Var6 = p_Var16[5]._M_left;
            bVar20 = true;
            for (p_Var14 = p_Var16[5]._M_parent; p_Var14 != p_Var6;
                p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_378,*(cmCPackComponent **)p_Var14,&local_598);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f0,"Problem to open archive <",0x19);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                 local_5d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
            local_5f8 = local_5e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_5f8,local_5f0);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            if (local_5f8 != local_5e8) {
              operator_delete(local_5f8,local_5e8[0] + 1);
            }
            pcVar5 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            plVar11 = local_5f8;
            sVar13 = strlen((char *)local_5f8);
            cmCPackLog::Log(pcVar5,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x154,(char *)plVar11,sVar13);
LAB_001e1ed6:
            if (local_5f8 != local_5e8) {
              operator_delete(local_5f8,local_5e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
            std::ios_base::~ios_base(local_480);
            bVar20 = false;
          }
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        if (!bVar20) {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_598.Files._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_598.Folders._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_598);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
LAB_001e206c:
          if (((ulong)local_5a8 & 1) == 0) {
            return 0;
          }
          break;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_5a0,&local_5d8);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_598.Files._M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_598.Folders._M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_598);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar20) goto LAB_001e206c;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        bVar20 = p_Var16 == local_5b8;
      } while (!bVar20);
    }
    p_Var14 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    p_Var16 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
               _M_header;
    bVar20 = p_Var14 == p_Var16;
    if (!bVar20) {
      local_5b0 = &this->ArchiveFormat;
      local_5a8 = p_Var16;
      do {
        if (*(long *)(p_Var14 + 4) == 0) {
          local_5b8 = (_Rb_tree_node_base *)CONCAT71(local_5b8._1_7_,bVar20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"Component <",0xb)
          ;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,*(char **)(p_Var14 + 2),
                               (long)p_Var14[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar5 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar8 = local_4f0._0_8_;
          sVar13 = strlen((char *)local_4f0._0_8_);
          cmCPackLog::Log(pcVar5,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x167,(char *)uVar8,sVar13);
          puVar18 = (ulong *)(local_298 + 0x10);
          if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
            operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
          std::ios_base::~ios_base(local_228);
          local_298._0_8_ = puVar18;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"CPACK_TEMPORARY_DIRECTORY","");
          psVar10 = (string *)
                    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_298);
          if (psVar10 == (string *)0x0) {
            psVar10 = &cmValue::Empty_abi_cxx11_;
          }
          local_598.Symlink._M_h._M_buckets = &local_598.Symlink._M_h._M_before_begin._M_nxt;
          pcVar4 = (psVar10->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_598,pcVar4,pcVar4 + psVar10->_M_string_length);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
          pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5d8,pcVar4,
                     pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1));
          std::__cxx11::string::_M_append((char *)&local_598,local_298._0_8_);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          GetArchiveComponentFileName((string *)local_4f0,this,(string *)(p_Var14 + 1),false);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_4f0,0,(char *)0x0,0x8e2661);
          puVar17 = (ulong *)(plVar11 + 2);
          if ((ulong *)*plVar11 == puVar17) {
            local_298._16_8_ = *puVar17;
            local_298._24_8_ = plVar11[3];
            local_298._0_8_ = puVar18;
          }
          else {
            local_298._16_8_ = *puVar17;
            local_298._0_8_ = (ulong *)*plVar11;
          }
          local_298._8_8_ = plVar11[1];
          *plVar11 = (long)puVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_5d8,local_298._0_8_);
          if ((ulong *)local_298._0_8_ != puVar18) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
            operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
          }
          cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
          cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d8,false,true);
          iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                            (this,(cmGeneratedFileStream *)local_298);
          if (iVar9 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f0,"Problem to generate Header for archive <",0x28);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                 local_5d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,">.",2);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar5 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            uVar8 = local_378._0_8_;
            sVar13 = strlen((char *)local_378._0_8_);
            cmCPackLog::Log(pcVar5,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x171,(char *)uVar8,sVar13);
            if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
              operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
            std::ios_base::~ios_base(local_480);
            bVar20 = false;
          }
          else {
            CVar3 = this->Compress;
            iVar9 = GetThreadCount(this);
            cmArchiveWrite::cmArchiveWrite
                      ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,local_5b0,0,iVar9);
            bVar20 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
            if (bVar20) {
              if (local_330 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f0,"Problem to create archive <",0x1b);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                     local_5d8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
                local_5f8 = local_5e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar12,(char *)local_5f8,local_5f0);
                std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                if (local_5f8 != local_5e8) {
                  operator_delete(local_5f8,local_5e8[0] + 1);
                }
                pcVar5 = (this->super_cmCPackGenerator).Logger;
                std::__cxx11::stringbuf::str();
                plVar11 = local_5f8;
                sVar13 = strlen((char *)local_5f8);
                cmCPackLog::Log(pcVar5,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                                ,0x171,(char *)plVar11,sVar13);
                goto LAB_001e2740;
              }
              bVar20 = true;
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_378,(cmCPackComponent *)(p_Var14 + 2),
                         (Deduplicator *)0x0);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,"Problem to open archive <",0x19);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                   local_5d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
              local_5f8 = local_5e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_5f8,local_5f0);
              std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              if (local_5f8 != local_5e8) {
                operator_delete(local_5f8,local_5e8[0] + 1);
              }
              pcVar5 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::stringbuf::str();
              plVar11 = local_5f8;
              sVar13 = strlen((char *)local_5f8);
              cmCPackLog::Log(pcVar5,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0x171,(char *)plVar11,sVar13);
LAB_001e2740:
              if (local_5f8 != local_5e8) {
                operator_delete(local_5f8,local_5e8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
              std::ios_base::~ios_base(local_480);
              bVar20 = false;
            }
            cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
          if (!bVar20) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
              operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var7 = local_5b8;
            if ((__node_base *)local_598.Symlink._M_h._M_buckets !=
                &local_598.Symlink._M_h._M_before_begin) {
              operator_delete(local_598.Symlink._M_h._M_buckets,
                              (ulong)((long)&(local_598.Symlink._M_h._M_before_begin._M_nxt)->_M_nxt
                                     + 1));
              p_Var7 = local_5b8;
            }
            goto joined_r0x001e2864;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_5a0,&local_5d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
          if ((__node_base *)local_598.Symlink._M_h._M_buckets !=
              &local_598.Symlink._M_h._M_before_begin) {
            operator_delete(local_598.Symlink._M_h._M_buckets,
                            (ulong)((long)&(local_598.Symlink._M_h._M_before_begin._M_nxt)->_M_nxt +
                                   1));
          }
          p_Var16 = local_5a8;
          p_Var7 = local_5b8;
          if (!bVar20) goto joined_r0x001e2864;
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        bVar20 = p_Var14 == p_Var16;
      } while (!bVar20);
    }
  }
  else {
    p_Var14 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_5b8 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    bVar20 = p_Var14 == local_5b8;
    if (!bVar20) {
      local_5b0 = &this->ArchiveFormat;
LAB_001e1179:
      puVar18 = (ulong *)(local_298 + 0x10);
      local_5a8 = (_Rb_tree_node_base *)CONCAT71(local_5a8._1_7_,bVar20);
      local_298._0_8_ = puVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"CPACK_TEMPORARY_DIRECTORY","");
      psVar10 = (string *)
                cmCPackGenerator::GetOption
                          (&this->super_cmCPackGenerator,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298);
      if (psVar10 == (string *)0x0) {
        psVar10 = &cmValue::Empty_abi_cxx11_;
      }
      local_598.Symlink._M_h._M_buckets = &local_598.Symlink._M_h._M_before_begin._M_nxt;
      pcVar4 = (psVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,pcVar4,pcVar4 + psVar10->_M_string_length);
      if ((ulong *)local_298._0_8_ != puVar18) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
      pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5d8,pcVar4,
                 pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     "/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1));
      std::__cxx11::string::_M_append((char *)&local_598,local_298._0_8_);
      if ((ulong *)local_298._0_8_ != puVar18) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      GetArchiveComponentFileName((string *)local_4f0,this,(string *)(p_Var14 + 1),false);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_4f0,0,(char *)0x0,0x8e2661);
      puVar17 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar17) {
        local_298._16_8_ = *puVar17;
        local_298._24_8_ = plVar11[3];
        local_298._0_8_ = puVar18;
      }
      else {
        local_298._16_8_ = *puVar17;
        local_298._0_8_ = (ulong *)*plVar11;
      }
      local_298._8_8_ = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_5d8,local_298._0_8_);
      if ((ulong *)local_298._0_8_ != puVar18) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
        operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
      }
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_298,&local_5d8,false,true);
      iVar9 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_298);
      if (iVar9 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4f0,"Problem to generate Header for archive <",0x28);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                             local_5d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,">.",2);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar5 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        uVar8 = local_378._0_8_;
        sVar13 = strlen((char *)local_378._0_8_);
        cmCPackLog::Log(pcVar5,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x186,(char *)uVar8,sVar13);
        if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
          operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
        std::ios_base::~ios_base(local_480);
        bVar20 = false;
      }
      else {
        CVar3 = this->Compress;
        iVar9 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_378,(ostream *)local_298,CVar3,local_5b0,0,iVar9);
        bVar20 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
        if (bVar20) {
          if (local_330 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f0,"Problem to create archive <",0x1b);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                                 local_5d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
            local_5f8 = local_5e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_5f8,local_5f0);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            if (local_5f8 != local_5e8) {
              operator_delete(local_5f8,local_5e8[0] + 1);
            }
            pcVar5 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            plVar11 = local_5f8;
            sVar13 = strlen((char *)local_5f8);
            cmCPackLog::Log(pcVar5,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x186,(char *)plVar11,sVar13);
            goto LAB_001e16d9;
          }
          bVar20 = true;
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_378,(cmCPackComponent *)(p_Var14 + 2),
                     (Deduplicator *)0x0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f0,"Problem to open archive <",0x19);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f0,local_5d8._M_dataplus._M_p,
                               local_5d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,">, ERROR = ",0xb);
          local_5f8 = local_5e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5f8,local_338._M_p,local_338._M_p + local_330);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_5f8,local_5f0);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          if (local_5f8 != local_5e8) {
            operator_delete(local_5f8,local_5e8[0] + 1);
          }
          pcVar5 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar11 = local_5f8;
          sVar13 = strlen((char *)local_5f8);
          cmCPackLog::Log(pcVar5,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x186,(char *)plVar11,sVar13);
LAB_001e16d9:
          if (local_5f8 != local_5e8) {
            operator_delete(local_5f8,local_5e8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
          std::ios_base::~ios_base(local_480);
          bVar20 = false;
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
      if (bVar20) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_5a0,&local_5d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if ((__node_base *)local_598.Symlink._M_h._M_buckets !=
            &local_598.Symlink._M_h._M_before_begin) {
          operator_delete(local_598.Symlink._M_h._M_buckets,
                          (ulong)((long)&(local_598.Symlink._M_h._M_before_begin._M_nxt)->_M_nxt + 1
                                 ));
        }
        p_Var7 = local_5a8;
        if (!bVar20) goto joined_r0x001e2864;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
        bVar20 = p_Var14 == local_5b8;
        if (bVar20) {
          return 1;
        }
        goto LAB_001e1179;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = local_5a8;
      if ((__node_base *)local_598.Symlink._M_h._M_buckets !=
          &local_598.Symlink._M_h._M_before_begin) {
        operator_delete(local_598.Symlink._M_h._M_buckets,
                        (ulong)((long)&(local_598.Symlink._M_h._M_before_begin._M_nxt)->_M_nxt + 1))
        ;
        p_Var7 = local_5a8;
      }
joined_r0x001e2864:
      if (((ulong)p_Var7 & 1) == 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  this->packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(this->toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      Deduplicator deduplicator;

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, comp, &deduplicator);
        }
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(this->toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, &(comp.second), nullptr);
        }
        // add the generated package to package file names list
        this->packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(this->toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        this->addOneComponentToArchive(archive, &(comp.second), nullptr);
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}